

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::rebuildOrderHeap(Solver *this)

{
  bool bVar1;
  lbool local_2d;
  int local_2c;
  
  if (((this->trail_lim).sz != 0) ||
     ((this->trail).sz + (this->order_heap->heap).sz < (this->vardata).sz)) {
    if ((this->decision_rebuild_vars).data != (int *)0x0) {
      (this->decision_rebuild_vars).sz = 0;
    }
    for (local_2c = 0; local_2c < (this->vardata).sz; local_2c = local_2c + 1) {
      if ((this->decision).data[local_2c] != '\0') {
        local_2d.value = (this->assigns).data[local_2c].value;
        bVar1 = lbool::operator==(&local_2d,(lbool)0x2);
        if (bVar1) {
          vec<int>::push(&this->decision_rebuild_vars,&local_2c);
        }
      }
    }
    Heap<Minisat::Solver::VarOrderLt>::build(this->order_heap,&this->decision_rebuild_vars);
    this->full_heap_size = (this->order_heap->heap).sz;
  }
  return;
}

Assistant:

void Solver::rebuildOrderHeap()
{
    /* all unassigned variables present, no need to rebuild */
    if (decisionLevel() == 0 && (order_heap->size() + trail.size() >= nVars())) {
        TRACE(for (Var v = 0; v < nVars(); v++) {
            assert((!decision[v] || value(v) != l_Undef || order_heap->inHeap(v)) &&
                   "unassigned variables have to be present in the heap");
        });
        return;
    }

    decision_rebuild_vars.clear();
    for (Var v = 0; v < nVars(); v++)
        if (decision[v] && value(v) == l_Undef) decision_rebuild_vars.push(v);

    order_heap->build(decision_rebuild_vars);
    full_heap_size = order_heap->size();
}